

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

int __thiscall rw::Skin::init(Skin *this,EVP_PKEY_CTX *ctx)

{
  uint8 *puVar1;
  int in_ECX;
  int32 in_EDX;
  float *local_28;
  uint8 *p;
  uint32 size;
  int32 numVertices_local;
  int32 numUsedBones_local;
  int32 numBones_local;
  Skin *this_local;
  
  this->numBones = (int32)ctx;
  this->numUsedBones = in_EDX;
  puVar1 = (uint8 *)mustmalloc_LOC((ulong)(this->numUsedBones + this->numBones * 0x40 +
                                           in_ECX * 0x14 + 0xf),0x30116,
                                   "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 399"
                                  );
  this->data = puVar1;
  local_28 = (float *)this->data;
  this->usedBones = (uint8 *)0x0;
  if (this->numUsedBones != 0) {
    this->usedBones = (uint8 *)local_28;
    local_28 = (float *)((long)local_28 + (long)this->numUsedBones);
  }
  local_28 = (float *)((ulong)((long)local_28 + 0xf) & 0xfffffffffffffff0);
  this->inverseMatrices = (float *)0x0;
  if (this->numBones != 0) {
    this->inverseMatrices = local_28;
    local_28 = (float *)((long)local_28 + (long)(this->numBones << 6));
  }
  this->indices = (uint8 *)0x0;
  if (in_ECX != 0) {
    this->indices = (uint8 *)local_28;
    local_28 = (float *)((long)local_28 + (long)(in_ECX << 2));
  }
  this->weights = (float *)0x0;
  if (in_ECX != 0) {
    this->weights = local_28;
  }
  this->boneLimit = 0;
  this->numMeshes = 0;
  this->rleSize = 0;
  this->remapIndices = (int8 *)0x0;
  this->rleCount = (RLEcount *)0x0;
  this->rle = (RLE *)0x0;
  this->platformData = (void *)0x0;
  this->legacyType = 0;
  return (int)this;
}

Assistant:

void
Skin::init(int32 numBones, int32 numUsedBones, int32 numVertices)
{
	this->numBones = numBones;
	this->numUsedBones = numUsedBones;
	uint32 size = this->numUsedBones +
	              this->numBones*64 +
	              numVertices*(16+4) + 0xF;
	this->data = rwNewT(uint8, size, MEMDUR_EVENT | ID_SKIN);
	uint8 *p = this->data;

	this->usedBones = nil;
	if(this->numUsedBones){
		this->usedBones = p;
		p += this->numUsedBones;
	}

	p = (uint8*)(((uintptr)p + 0xF) & ~0xF);
	this->inverseMatrices = nil;
	if(this->numBones){
		this->inverseMatrices = (float*)p;
		p += 64*this->numBones;
	}

	this->indices = nil;
	if(numVertices){
		this->indices = p;
		p += 4*numVertices;
	}

	this->weights = nil;
	if(numVertices)
		this->weights = (float*)p;

	this->boneLimit = 0;
	this->numMeshes = 0;
	this->rleSize = 0;
	this->remapIndices = nil;
	this->rleCount = nil;
	this->rle = nil;

	this->platformData = nil;
	this->legacyType = 0;
}